

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O1

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,AdvanceClock *a)

{
  AdvanceClock *pAVar1;
  CodeLocation local_18;
  
  local_18.sourceCode.object =
       (a->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object;
  if (local_18.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_18.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_18.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_18.location.data =
       (a->super_Expression).super_Statement.super_ASTObject.context.location.location.data;
  pAVar1 = PoolAllocator::allocate<soul::heart::AdvanceClock,soul::CodeLocation>
                     (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_18);
  (*(this->builder).super_BlockBuilder._vptr_BlockBuilder[2])(&this->builder,pAVar1);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_18.sourceCode.object);
  return;
}

Assistant:

void visit (AST::AdvanceClock& a) override
    {
        builder.addAdvance (a.context.location);
    }